

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::AndroidLogConfig::operator==(AndroidLogConfig *this,AndroidLogConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  bool local_19;
  AndroidLogConfig *other_local;
  AndroidLogConfig *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (_Var1) {
    bVar2 = ::std::operator==(&this->log_ids_,&other->log_ids_);
    local_19 = false;
    if ((bVar2) && (local_19 = false, this->min_prio_ == other->min_prio_)) {
      local_19 = ::std::operator==(&this->filter_tags_,&other->filter_tags_);
    }
  }
  return local_19;
}

Assistant:

bool AndroidLogConfig::operator==(const AndroidLogConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && log_ids_ == other.log_ids_
   && min_prio_ == other.min_prio_
   && filter_tags_ == other.filter_tags_;
}